

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inffast.c
# Opt level: O0

void inflate_fast(z_streamp strm,uint start)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  internal_state *piVar6;
  uchar *puVar7;
  ulg uVar8;
  Posf *pPVar9;
  int iVar10;
  ulg uVar11;
  uchar *puVar12;
  uint uVar13;
  uint uVar14;
  uInt uVar15;
  Bytef *pBVar16;
  Bytef *pBVar17;
  Bytef *pBVar18;
  byte *pbVar19;
  uchar *puVar20;
  uInt local_c8;
  uInt local_c0;
  uchar *local_a0;
  uchar *from;
  uint dist;
  uint len;
  uint op;
  code here;
  uint dmask;
  uint lmask;
  code *dcode;
  code *lcode;
  ulong uStack_68;
  uint bits;
  unsigned_long hold;
  uchar *window;
  uint wnext;
  uint whave;
  uint wsize;
  uchar *end;
  uchar *beg;
  uchar *out;
  uchar *last;
  uchar *in;
  inflate_state *state;
  uint start_local;
  z_streamp strm_local;
  
  piVar6 = strm->state;
  last = strm->next_in;
  pBVar16 = last + (strm->avail_in - 5);
  beg = strm->next_out;
  uVar15 = strm->avail_out;
  iVar10 = (int)beg;
  pBVar17 = beg + (strm->avail_out - 0x101);
  iVar2 = *(int *)((long)&piVar6->gzhead + 4);
  uVar11 = piVar6->gzindex;
  uVar3 = *(uint *)((long)&piVar6->gzindex + 4);
  puVar7 = *(uchar **)&piVar6->method;
  uStack_68._0_4_ = piVar6->w_size;
  uStack_68._4_4_ = piVar6->w_bits;
  lcode._4_4_ = piVar6->w_mask;
  uVar8 = piVar6->window_size;
  pPVar9 = piVar6->prev;
  uVar4 = *(undefined4 *)&piVar6->head;
  uVar5 = *(undefined4 *)((long)&piVar6->head + 4);
LAB_00135521:
  if (lcode._4_4_ < 0xf) {
    pbVar19 = last + 1;
    bVar1 = *last;
    last = last + 2;
    uStack_68 = ((ulong)*pbVar19 << ((byte)lcode._4_4_ + 8 & 0x3f)) +
                ((ulong)bVar1 << ((byte)lcode._4_4_ & 0x3f)) + uStack_68;
    lcode._4_4_ = lcode._4_4_ + 0x10;
  }
  len = *(uint *)(uVar8 + (uStack_68 & (1 << ((byte)uVar4 & 0x1f)) - 1) * 4);
  while( true ) {
    uStack_68 = uStack_68 >> (len._1_1_ & 0x3f);
    lcode._4_4_ = lcode._4_4_ - len._1_1_;
    if ((len & 0xff) == 0) break;
    if ((len & 0x10) != 0) {
      from._4_4_ = (uint)len._2_2_;
      uVar13 = len & 0xf;
      if (uVar13 != 0) {
        if (lcode._4_4_ < uVar13) {
          uStack_68 = ((ulong)*last << ((byte)lcode._4_4_ & 0x3f)) + uStack_68;
          lcode._4_4_ = lcode._4_4_ + 8;
          last = last + 1;
        }
        from._4_4_ = ((uint)uStack_68 & (1 << (sbyte)uVar13) - 1U) + from._4_4_;
        uStack_68 = uStack_68 >> (sbyte)uVar13;
        lcode._4_4_ = lcode._4_4_ - uVar13;
      }
      if (lcode._4_4_ < 0xf) {
        pbVar19 = last + 1;
        bVar1 = *last;
        last = last + 2;
        uStack_68 = ((ulong)*pbVar19 << ((byte)lcode._4_4_ + 8 & 0x3f)) +
                    ((ulong)bVar1 << ((byte)lcode._4_4_ & 0x3f)) + uStack_68;
        lcode._4_4_ = lcode._4_4_ + 0x10;
      }
      len = *(uint *)(pPVar9 + (uStack_68 & (1 << ((byte)uVar5 & 0x1f)) - 1) * 2);
      goto LAB_00135712;
    }
    if ((len & 0x40) != 0) {
      if ((len & 0x20) == 0) {
        strm->msg = "invalid literal/length code";
        piVar6->status = 0x3f51;
      }
      else {
        piVar6->status = 0x3f3f;
      }
      goto LAB_00135e5f;
    }
    len = *(uint *)(uVar8 + ((ulong)len._2_2_ + (uStack_68 & (1 << ((byte)len & 0x1f)) - 1)) * 4);
  }
  *beg = (uchar)(len >> 0x10);
  puVar20 = beg + 1;
  goto LAB_00135e2c;
LAB_00135712:
  uStack_68 = uStack_68 >> (len._1_1_ & 0x3f);
  uVar13 = lcode._4_4_ - len._1_1_;
  lcode._4_4_ = uVar13;
  if ((len & 0x10) != 0) goto code_r0x0013575f;
  if ((len & 0x40) != 0) {
    strm->msg = "invalid distance code";
    piVar6->status = 0x3f51;
    goto LAB_00135e5f;
  }
  len = *(uint *)(pPVar9 + ((ulong)len._2_2_ + (uStack_68 & (1 << ((byte)len & 0x1f)) - 1)) * 2);
  goto LAB_00135712;
code_r0x0013575f:
  uVar14 = len & 0xf;
  pbVar19 = last;
  if (uVar13 < uVar14) {
    uStack_68 = ((ulong)*last << ((byte)uVar13 & 0x3f)) + uStack_68;
    lcode._4_4_ = uVar13 + 8;
    pbVar19 = last + 1;
    if (lcode._4_4_ < uVar14) {
      uStack_68 = ((ulong)last[1] << ((byte)lcode._4_4_ & 0x3f)) + uStack_68;
      lcode._4_4_ = uVar13 + 0x10;
      pbVar19 = last + 2;
    }
  }
  last = pbVar19;
  uVar13 = ((uint)uStack_68 & (1 << (sbyte)uVar14) - 1U) + (uint)len._2_2_;
  uStack_68 = uStack_68 >> (sbyte)uVar14;
  lcode._4_4_ = lcode._4_4_ - uVar14;
  uVar14 = (int)beg - (iVar10 - (start - uVar15));
  if (uVar14 < uVar13) {
    dist = uVar13 - uVar14;
    if (((uint)uVar11 < dist) && (piVar6[1].dyn_ltree[0xf5] != (ct_data_s)0x0)) {
      strm->msg = "invalid distance too far back";
      piVar6->status = 0x3f51;
      goto LAB_00135e5f;
    }
    if (uVar3 == 0) {
      local_a0 = puVar7 + (iVar2 - dist);
      if (dist < from._4_4_) {
        from._4_4_ = from._4_4_ - dist;
        do {
          puVar20 = beg + 1;
          *beg = *local_a0;
          dist = dist - 1;
          local_a0 = local_a0 + 1;
          beg = puVar20;
        } while (dist != 0);
        local_a0 = puVar20 + -(ulong)uVar13;
      }
    }
    else if (uVar3 < dist) {
      uVar14 = (iVar2 + uVar3) - dist;
      dist = dist - uVar3;
      local_a0 = puVar7 + uVar14;
      if (dist < from._4_4_) {
        from._4_4_ = from._4_4_ - dist;
        do {
          puVar20 = beg + 1;
          *beg = *local_a0;
          dist = dist - 1;
          local_a0 = local_a0 + 1;
          beg = puVar20;
        } while (dist != 0);
        local_a0 = puVar7;
        if (uVar3 < from._4_4_) {
          from._4_4_ = from._4_4_ - uVar3;
          dist = uVar3;
          do {
            puVar20 = beg + 1;
            *beg = *local_a0;
            dist = dist - 1;
            local_a0 = local_a0 + 1;
            beg = puVar20;
          } while (dist != 0);
          local_a0 = puVar20 + -(ulong)uVar13;
        }
      }
    }
    else {
      local_a0 = puVar7 + (uVar3 - dist);
      if (dist < from._4_4_) {
        from._4_4_ = from._4_4_ - dist;
        do {
          puVar20 = beg + 1;
          *beg = *local_a0;
          dist = dist - 1;
          local_a0 = local_a0 + 1;
          beg = puVar20;
        } while (dist != 0);
        local_a0 = puVar20 + -(ulong)uVar13;
      }
    }
    for (; 2 < from._4_4_; from._4_4_ = from._4_4_ - 3) {
      *beg = *local_a0;
      beg[1] = local_a0[1];
      beg[2] = local_a0[2];
      local_a0 = local_a0 + 3;
      beg = beg + 3;
    }
    puVar20 = beg;
    if (from._4_4_ != 0) {
      *beg = *local_a0;
      puVar20 = beg + 1;
      if (1 < from._4_4_) {
        beg[1] = local_a0[1];
        puVar20 = beg + 2;
      }
    }
  }
  else {
    puVar12 = beg + -(ulong)uVar13;
    puVar20 = beg;
    do {
      beg = puVar20;
      local_a0 = puVar12;
      *beg = *local_a0;
      beg[1] = local_a0[1];
      puVar20 = beg + 3;
      beg[2] = local_a0[2];
      from._4_4_ = from._4_4_ - 3;
      puVar12 = local_a0 + 3;
    } while (2 < from._4_4_);
    if (from._4_4_ != 0) {
      *puVar20 = local_a0[3];
      puVar20 = beg + 4;
      if (1 < from._4_4_) {
        beg[4] = local_a0[4];
        puVar20 = beg + 5;
      }
    }
  }
LAB_00135e2c:
  beg = puVar20;
  if (pBVar16 <= last || pBVar17 <= beg) {
LAB_00135e5f:
    pBVar18 = last + -(ulong)(lcode._4_4_ >> 3);
    uVar15 = lcode._4_4_ + (lcode._4_4_ >> 3) * -8;
    uStack_68 = (1 << ((byte)uVar15 & 0x1f)) - 1 & uStack_68;
    strm->next_in = pBVar18;
    strm->next_out = beg;
    if (pBVar18 < pBVar16) {
      iVar2 = (int)pBVar16 - (int)pBVar18;
    }
    else {
      iVar2 = -((int)pBVar18 - (int)pBVar16);
    }
    local_c0 = iVar2 + 5;
    strm->avail_in = local_c0;
    if (beg < pBVar17) {
      iVar2 = (int)pBVar17 - (int)beg;
    }
    else {
      iVar2 = -((int)beg - (int)pBVar17);
    }
    local_c8 = iVar2 + 0x101;
    strm->avail_out = local_c8;
    piVar6->w_size = (int)uStack_68;
    piVar6->w_bits = (int)(uStack_68 >> 0x20);
    piVar6->w_mask = uVar15;
    return;
  }
  goto LAB_00135521;
}

Assistant:

void ZLIB_INTERNAL inflate_fast(strm, start)
z_streamp strm;
unsigned start;         /* inflate()'s starting value for strm->avail_out */
{
    struct inflate_state FAR *state;
    z_const unsigned char FAR *in;      /* local strm->next_in */
    z_const unsigned char FAR *last;    /* have enough input while in < last */
    unsigned char FAR *out;     /* local strm->next_out */
    unsigned char FAR *beg;     /* inflate()'s initial strm->next_out */
    unsigned char FAR *end;     /* while out < end, enough space available */
#ifdef INFLATE_STRICT
    unsigned dmax;              /* maximum distance from zlib header */
#endif
    unsigned wsize;             /* window size or zero if not using window */
    unsigned whave;             /* valid bytes in the window */
    unsigned wnext;             /* window write index */
    unsigned char FAR *window;  /* allocated sliding window, if wsize != 0 */
    unsigned long hold;         /* local strm->hold */
    unsigned bits;              /* local strm->bits */
    code const FAR *lcode;      /* local strm->lencode */
    code const FAR *dcode;      /* local strm->distcode */
    unsigned lmask;             /* mask for first level of length codes */
    unsigned dmask;             /* mask for first level of distance codes */
    code here;                  /* retrieved table entry */
    unsigned op;                /* code bits, operation, extra bits, or */
                                /*  window position, window bytes to copy */
    unsigned len;               /* match length, unused bytes */
    unsigned dist;              /* match distance */
    unsigned char FAR *from;    /* where to copy match from */

    /* copy state to local variables */
    state = (struct inflate_state FAR *)strm->state;
    in = strm->next_in;
    last = in + (strm->avail_in - 5);
    out = strm->next_out;
    beg = out - (start - strm->avail_out);
    end = out + (strm->avail_out - 257);
#ifdef INFLATE_STRICT
    dmax = state->dmax;
#endif
    wsize = state->wsize;
    whave = state->whave;
    wnext = state->wnext;
    window = state->window;
    hold = state->hold;
    bits = state->bits;
    lcode = state->lencode;
    dcode = state->distcode;
    lmask = (1U << state->lenbits) - 1;
    dmask = (1U << state->distbits) - 1;

    /* decode literals and length/distances until end-of-block or not enough
       input data or output space */
    do {
        if (bits < 15) {
            hold += (unsigned long)(*in++) << bits;
            bits += 8;
            hold += (unsigned long)(*in++) << bits;
            bits += 8;
        }
        here = lcode[hold & lmask];
      dolen:
        op = (unsigned)(here.bits);
        hold >>= op;
        bits -= op;
        op = (unsigned)(here.op);
        if (op == 0) {                          /* literal */
            Tracevv((stderr, here.val >= 0x20 && here.val < 0x7f ?
                    "inflate:         literal '%c'\n" :
                    "inflate:         literal 0x%02x\n", here.val));
            *out++ = (unsigned char)(here.val);
        }
        else if (op & 16) {                     /* length base */
            len = (unsigned)(here.val);
            op &= 15;                           /* number of extra bits */
            if (op) {
                if (bits < op) {
                    hold += (unsigned long)(*in++) << bits;
                    bits += 8;
                }
                len += (unsigned)hold & ((1U << op) - 1);
                hold >>= op;
                bits -= op;
            }
            Tracevv((stderr, "inflate:         length %u\n", len));
            if (bits < 15) {
                hold += (unsigned long)(*in++) << bits;
                bits += 8;
                hold += (unsigned long)(*in++) << bits;
                bits += 8;
            }
            here = dcode[hold & dmask];
          dodist:
            op = (unsigned)(here.bits);
            hold >>= op;
            bits -= op;
            op = (unsigned)(here.op);
            if (op & 16) {                      /* distance base */
                dist = (unsigned)(here.val);
                op &= 15;                       /* number of extra bits */
                if (bits < op) {
                    hold += (unsigned long)(*in++) << bits;
                    bits += 8;
                    if (bits < op) {
                        hold += (unsigned long)(*in++) << bits;
                        bits += 8;
                    }
                }
                dist += (unsigned)hold & ((1U << op) - 1);
#ifdef INFLATE_STRICT
                if (dist > dmax) {
                    strm->msg = (char *)"invalid distance too far back";
                    state->mode = BAD;
                    break;
                }
#endif
                hold >>= op;
                bits -= op;
                Tracevv((stderr, "inflate:         distance %u\n", dist));
                op = (unsigned)(out - beg);     /* max distance in output */
                if (dist > op) {                /* see if copy from window */
                    op = dist - op;             /* distance back in window */
                    if (op > whave) {
                        if (state->sane) {
                            strm->msg =
                                (char *)"invalid distance too far back";
                            state->mode = BAD;
                            break;
                        }
#ifdef INFLATE_ALLOW_INVALID_DISTANCE_TOOFAR_ARRR
                        if (len <= op - whave) {
                            do {
                                *out++ = 0;
                            } while (--len);
                            continue;
                        }
                        len -= op - whave;
                        do {
                            *out++ = 0;
                        } while (--op > whave);
                        if (op == 0) {
                            from = out - dist;
                            do {
                                *out++ = *from++;
                            } while (--len);
                            continue;
                        }
#endif
                    }
                    from = window;
                    if (wnext == 0) {           /* very common case */
                        from += wsize - op;
                        if (op < len) {         /* some from window */
                            len -= op;
                            do {
                                *out++ = *from++;
                            } while (--op);
                            from = out - dist;  /* rest from output */
                        }
                    }
                    else if (wnext < op) {      /* wrap around window */
                        from += wsize + wnext - op;
                        op -= wnext;
                        if (op < len) {         /* some from end of window */
                            len -= op;
                            do {
                                *out++ = *from++;
                            } while (--op);
                            from = window;
                            if (wnext < len) {  /* some from start of window */
                                op = wnext;
                                len -= op;
                                do {
                                    *out++ = *from++;
                                } while (--op);
                                from = out - dist;      /* rest from output */
                            }
                        }
                    }
                    else {                      /* contiguous in window */
                        from += wnext - op;
                        if (op < len) {         /* some from window */
                            len -= op;
                            do {
                                *out++ = *from++;
                            } while (--op);
                            from = out - dist;  /* rest from output */
                        }
                    }
                    while (len > 2) {
                        *out++ = *from++;
                        *out++ = *from++;
                        *out++ = *from++;
                        len -= 3;
                    }
                    if (len) {
                        *out++ = *from++;
                        if (len > 1)
                            *out++ = *from++;
                    }
                }
                else {
                    from = out - dist;          /* copy direct from output */
                    do {                        /* minimum length is three */
                        *out++ = *from++;
                        *out++ = *from++;
                        *out++ = *from++;
                        len -= 3;
                    } while (len > 2);
                    if (len) {
                        *out++ = *from++;
                        if (len > 1)
                            *out++ = *from++;
                    }
                }
            }
            else if ((op & 64) == 0) {          /* 2nd level distance code */
                here = dcode[here.val + (hold & ((1U << op) - 1))];
                goto dodist;
            }
            else {
                strm->msg = (char *)"invalid distance code";
                state->mode = BAD;
                break;
            }
        }
        else if ((op & 64) == 0) {              /* 2nd level length code */
            here = lcode[here.val + (hold & ((1U << op) - 1))];
            goto dolen;
        }
        else if (op & 32) {                     /* end-of-block */
            Tracevv((stderr, "inflate:         end of block\n"));
            state->mode = TYPE;
            break;
        }
        else {
            strm->msg = (char *)"invalid literal/length code";
            state->mode = BAD;
            break;
        }
    } while (in < last && out < end);

    /* return unused bytes (on entry, bits < 8, so in won't go too far back) */
    len = bits >> 3;
    in -= len;
    bits -= len << 3;
    hold &= (1U << bits) - 1;

    /* update state and return */
    strm->next_in = in;
    strm->next_out = out;
    strm->avail_in = (unsigned)(in < last ? 5 + (last - in) : 5 - (in - last));
    strm->avail_out = (unsigned)(out < end ?
                                 257 + (end - out) : 257 - (out - end));
    state->hold = hold;
    state->bits = bits;
    return;
}